

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *os,ErrorReason reason)

{
  ostream *poVar1;
  
  if (reason < (InvalidUnsharedDescribes|InvalidSupertype)) {
    poVar1 = std::operator<<(os,&DAT_00e5b854 + *(int *)(&DAT_00e5b854 + (ulong)reason * 4));
    return poVar1;
  }
  handle_unreachable("Unexpected error reason",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                     ,0x5cc);
}

Assistant:

std::ostream& operator<<(std::ostream& os, TypeBuilder::ErrorReason reason) {
  switch (reason) {
    case TypeBuilder::ErrorReason::SelfSupertype:
      return os << "Heap type is a supertype of itself";
    case TypeBuilder::ErrorReason::InvalidSupertype:
      return os << "Heap type has an invalid supertype";
    case TypeBuilder::ErrorReason::ForwardSupertypeReference:
      return os << "Heap type has an undeclared supertype";
    case TypeBuilder::ErrorReason::ForwardChildReference:
      return os << "Heap type has an undeclared child";
    case TypeBuilder::ErrorReason::InvalidFuncType:
      return os << "Continuation has invalid function type";
    case TypeBuilder::ErrorReason::InvalidUnsharedField:
      return os << "Heap type has an invalid unshared field";
    case TypeBuilder::ErrorReason::NonStructDescribes:
      return os << "Describes clause on a non-struct type";
    case TypeBuilder::ErrorReason::ForwardDescribesReference:
      return os << "Describes clause is a forward reference";
    case TypeBuilder::ErrorReason::MismatchedDescribes:
      return os << "Described type is not a matching descriptor";
    case TypeBuilder::ErrorReason::NonStructDescriptor:
      return os << "Descriptor clause on a non-struct type";
    case TypeBuilder::ErrorReason::MismatchedDescriptor:
      return os << "Descriptor type does not describe heap type";
    case TypeBuilder::ErrorReason::InvalidUnsharedDescriptor:
      return os << "Heap type has an invalid unshared descriptor";
    case TypeBuilder::ErrorReason::InvalidUnsharedDescribes:
      return os << "Heap type describes an invalid unshared type";
  }
  WASM_UNREACHABLE("Unexpected error reason");
}